

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_pixel_ops.cpp
# Opt level: O1

bool dxil_spv::emit_derivative_instruction(Op opcode,Impl *impl,CallInst *instruction)

{
  CallInst *value;
  bool bVar1;
  bool bVar2;
  TypeID TVar3;
  Id IVar4;
  TypeID TVar5;
  Id IVar6;
  Builder *pBVar7;
  Type *pTVar8;
  Operation *pOVar9;
  Value *pVVar10;
  Operation *pOVar11;
  Operation *pOVar12;
  uint value_00;
  Capability local_4c;
  CallInst *local_48;
  Operation *local_40;
  Operation *local_38;
  
  pBVar7 = Converter::Impl::builder(impl);
  if ((impl->execution_mode_meta).synthesize_dummy_derivatives == true) {
    pTVar8 = LLVMBC::Value::getType((Value *)instruction);
    TVar3 = LLVMBC::Type::getTypeID(pTVar8);
    if ((TVar3 == HalfTyID) &&
       (bVar1 = Converter::Impl::support_native_fp16_operations(impl), bVar1)) {
      IVar4 = spv::Builder::makeFloat16Constant(pBVar7,0,false);
    }
    else {
      IVar4 = spv::Builder::makeFloatConstant(pBVar7,0.0,false);
    }
    Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar4);
  }
  else if ((impl->execution_model == ExecutionModelFragment) ||
          ((impl->options).compute_shader_derivatives != false)) {
    pTVar8 = LLVMBC::Value::getType((Value *)instruction);
    TVar3 = LLVMBC::Type::getTypeID(pTVar8);
    bVar1 = TVar3 == FloatTyID;
    pTVar8 = LLVMBC::Value::getType((Value *)instruction);
    TVar5 = LLVMBC::Type::getTypeID(pTVar8);
    if (TVar5 == HalfTyID) {
      bVar2 = Converter::Impl::support_native_fp16_operations(impl);
      bVar2 = !bVar2;
      bVar1 = TVar3 == FloatTyID || bVar2;
    }
    else {
      bVar2 = false;
    }
    if (bVar1) {
      local_48 = instruction;
      pOVar9 = Converter::Impl::allocate(impl,opcode,(Value *)instruction);
      pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      IVar4 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
    }
    else {
      local_48 = instruction;
      IVar6 = spv::Builder::makeFloatType(pBVar7,0x20);
      pOVar9 = Converter::Impl::allocate(impl,OpFConvert,IVar6);
      pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      IVar4 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
      Operation::add_id(pOVar9,IVar4);
      Converter::Impl::add(impl,pOVar9,false);
      IVar4 = pOVar9->id;
      pOVar9 = Converter::Impl::allocate(impl,opcode,IVar6);
    }
    Operation::add_id(pOVar9,IVar4);
    Converter::Impl::add(impl,pOVar9,false);
    value = local_48;
    if (bVar2) {
      pTVar8 = LLVMBC::Value::getType((Value *)local_48);
      Converter::Impl::decorate_relaxed_precision(impl,pTVar8,pOVar9->id,false);
    }
    if (!bVar1) {
      pOVar11 = Converter::Impl::allocate(impl,OpFConvert,(Value *)value);
      Operation::add_id(pOVar11,pOVar9->id);
      Converter::Impl::add(impl,pOVar11,false);
    }
    pBVar7 = Converter::Impl::builder(impl);
    local_4c = CapabilityDerivativeControl;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&pBVar7->capabilities,&local_4c);
  }
  else {
    if (opcode - OpDPdxFine < 2) {
      emit_expect_assume_quad_uniform(impl);
      pBVar7 = Converter::Impl::builder(impl);
      local_4c = CapabilityGroupNonUniform;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&pBVar7->capabilities,&local_4c);
      local_4c = CapabilityGroupNonUniformQuad;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&pBVar7->capabilities,&local_4c);
      local_48 = instruction;
      pTVar8 = LLVMBC::Value::getType((Value *)instruction);
      IVar4 = Converter::Impl::get_type_id(impl,pTVar8,0);
      local_40 = (Operation *)CONCAT44(local_40._4_4_,IVar4);
      pOVar9 = Converter::Impl::allocate(impl,OpGroupNonUniformQuadSwap,IVar4);
      IVar4 = spv::Builder::makeIntegerType(pBVar7,0x20,false);
      IVar4 = spv::Builder::makeIntConstant(pBVar7,IVar4,3,false);
      Operation::add_id(pOVar9,IVar4);
      pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      IVar4 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
      Operation::add_id(pOVar9,IVar4);
      IVar4 = spv::Builder::makeIntegerType(pBVar7,0x20,false);
      value_00 = (uint)(opcode == OpDPdyFine);
      IVar4 = spv::Builder::makeIntConstant(pBVar7,IVar4,value_00,false);
      Operation::add_id(pOVar9,IVar4);
      Converter::Impl::add(impl,pOVar9,false);
      IVar4 = (Id)local_40;
      pOVar11 = Converter::Impl::allocate(impl,OpFSub,(Id)local_40);
      Operation::add_id(pOVar11,pOVar9->id);
      pVVar10 = LLVMBC::Instruction::getOperand(&local_48->super_Instruction,1);
      IVar6 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
      Operation::add_id(pOVar11,IVar6);
      local_38 = pOVar11;
      Converter::Impl::add(impl,pOVar11,false);
      pOVar9 = Converter::Impl::allocate(impl,OpGroupNonUniformQuadSwap,IVar4);
      local_40 = pOVar9;
      IVar4 = spv::Builder::makeIntegerType(pBVar7,0x20,false);
      IVar4 = spv::Builder::makeIntConstant(pBVar7,IVar4,3,false);
      Operation::add_id(pOVar9,IVar4);
      Operation::add_id(pOVar9,pOVar11->id);
      IVar4 = spv::Builder::makeIntegerType(pBVar7,0x20,false);
      IVar4 = spv::Builder::makeIntConstant(pBVar7,IVar4,value_00,false);
      Operation::add_id(pOVar9,IVar4);
      Converter::Impl::add(impl,pOVar9,false);
      IVar4 = SPIRVModule::get_builtin_shader_input
                        (impl->spirv_module,BuiltInSubgroupLocalInvocationId);
      IVar6 = spv::Builder::makeIntegerType(pBVar7,0x20,false);
      pOVar9 = Converter::Impl::allocate(impl,OpLoad,IVar6);
      Operation::add_id(pOVar9,IVar4);
      Converter::Impl::add(impl,pOVar9,false);
      IVar4 = spv::Builder::makeIntegerType(pBVar7,0x20,false);
      pOVar11 = Converter::Impl::allocate(impl,OpBitwiseAnd,IVar4);
      Operation::add_id(pOVar11,pOVar9->id);
      IVar4 = spv::Builder::makeIntegerType(pBVar7,0x20,false);
      IVar4 = spv::Builder::makeIntConstant(pBVar7,IVar4,value_00 + 1,false);
      Operation::add_id(pOVar11,IVar4);
      Converter::Impl::add(impl,pOVar11,false);
      IVar4 = spv::Builder::makeBoolType(pBVar7);
      pOVar12 = Converter::Impl::allocate(impl,OpINotEqual,IVar4);
      Operation::add_id(pOVar12,pOVar11->id);
      IVar4 = spv::Builder::makeIntegerType(pBVar7,0x20,false);
      IVar4 = spv::Builder::makeIntConstant(pBVar7,IVar4,0,false);
      Operation::add_id(pOVar12,IVar4);
      Converter::Impl::add(impl,pOVar12,false);
      pOVar9 = Converter::Impl::allocate(impl,OpSelect,(Value *)local_48);
      Operation::add_id(pOVar9,pOVar12->id);
      Operation::add_id(pOVar9,local_40->id);
      Operation::add_id(pOVar9,local_38->id);
    }
    else {
      if (1 < opcode - OpDPdxCoarse) {
        return false;
      }
      emit_expect_assume_quad_uniform(impl);
      pBVar7 = Converter::Impl::builder(impl);
      local_4c = CapabilityGroupNonUniformQuad;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&pBVar7->capabilities,&local_4c);
      pTVar8 = LLVMBC::Value::getType((Value *)instruction);
      IVar4 = Converter::Impl::get_type_id(impl,pTVar8,0);
      pOVar9 = Converter::Impl::allocate(impl,OpGroupNonUniformQuadBroadcast,IVar4);
      IVar6 = spv::Builder::makeIntegerType(pBVar7,0x20,false);
      IVar6 = spv::Builder::makeIntConstant(pBVar7,IVar6,3,false);
      Operation::add_id(pOVar9,IVar6);
      pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      IVar6 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
      local_38 = pOVar9;
      Operation::add_id(pOVar9,IVar6);
      IVar6 = spv::Builder::makeIntegerType(pBVar7,0x20,false);
      IVar6 = spv::Builder::makeIntConstant(pBVar7,IVar6,0,false);
      Operation::add_id(pOVar9,IVar6);
      pOVar12 = Converter::Impl::allocate(impl,OpGroupNonUniformQuadBroadcast,IVar4);
      IVar4 = spv::Builder::makeIntegerType(pBVar7,0x20,false);
      IVar4 = spv::Builder::makeIntConstant(pBVar7,IVar4,3,false);
      Operation::add_id(pOVar12,IVar4);
      pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      IVar4 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
      Operation::add_id(pOVar12,IVar4);
      IVar4 = spv::Builder::makeIntegerType(pBVar7,0x20,false);
      IVar4 = spv::Builder::makeIntConstant(pBVar7,IVar4,(opcode == OpDPdyCoarse) + 1,false);
      Operation::add_id(pOVar12,IVar4);
      pOVar9 = Converter::Impl::allocate(impl,OpFSub,(Value *)instruction);
      Operation::add_id(pOVar9,pOVar12->id);
      pOVar11 = local_38;
      Operation::add_id(pOVar9,local_38->id);
      Converter::Impl::add(impl,pOVar11,false);
      Converter::Impl::add(impl,pOVar12,false);
    }
    Converter::Impl::add(impl,pOVar9,false);
  }
  return true;
}

Assistant:

bool emit_derivative_instruction(spv::Op opcode, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	if (impl.execution_mode_meta.synthesize_dummy_derivatives)
	{
		spv::Id constant_0;
		if (instruction->getType()->getTypeID() == llvm::Type::TypeID::HalfTyID &&
		    impl.support_native_fp16_operations())
		{
			constant_0 = builder.makeFloat16Constant(0);
		}
		else
		{
			constant_0 = builder.makeFloatConstant(0.0f);
		}

		impl.rewrite_value(instruction, constant_0);
		return true;
	}

	if (impl.execution_model != spv::ExecutionModelFragment &&
	    !impl.options.compute_shader_derivatives)
	{
		return emit_derivative_instruction_quad(opcode, impl, instruction);
	}

	bool relax_precision = false;
	spv::Id input_id;

	// SPIR-V only supports 32-bit derivatives.
	bool fp32 = instruction->getType()->getTypeID() == llvm::Type::TypeID::FloatTyID;

	if (instruction->getType()->getTypeID() == llvm::Type::TypeID::HalfTyID &&
	    !impl.support_native_fp16_operations())
	{
		fp32 = true;
		relax_precision = true;
	}

	Operation *op;
	if (fp32)
	{
		op = impl.allocate(opcode, instruction);
		// Somewhat redundant, but avoid changing reference output
		// for all shaders that use derivatives with constants.
		input_id = impl.get_id_for_value(instruction->getOperand(1));
	}
	else
	{
		spv::Id fp32_type = builder.makeFloatType(32);
		auto *cast_op = impl.allocate(spv::OpFConvert, fp32_type);
		cast_op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		impl.add(cast_op);
		input_id = cast_op->id;

		op = impl.allocate(opcode, fp32_type);
	}

	op->add_id(input_id);
	impl.add(op);

	if (relax_precision)
		impl.decorate_relaxed_precision(instruction->getType(), op->id, false);

	if (!fp32)
	{
		auto *cast_op = impl.allocate(spv::OpFConvert, instruction);
		cast_op->add_id(op->id);
		impl.add(cast_op);
	}

	impl.builder().addCapability(spv::CapabilityDerivativeControl);
	return true;
}